

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O2

void duckdb::ReservoirQuantileOperation::
     Combine<duckdb::ReservoirQuantileState<float>,duckdb::ReservoirQuantileScalarOperation>
               (ReservoirQuantileState<float> *source,ReservoirQuantileState<float> *target,
               AggregateInputData *param_3)

{
  BaseReservoirSampling *this;
  idx_t src_idx;
  ulong uVar1;
  
  if (source->pos != 0) {
    if (target->pos == 0) {
      ReservoirQuantileState<float>::Resize(target,source->len);
    }
    if (target->r_samp == (BaseReservoirSampling *)0x0) {
      this = (BaseReservoirSampling *)operator_new(0x78);
      BaseReservoirSampling::BaseReservoirSampling(this);
      target->r_samp = this;
    }
    for (uVar1 = 0; uVar1 < source->pos; uVar1 = uVar1 + 1) {
      ReservoirQuantileState<float>::FillReservoir(target,target->len,source->v[uVar1]);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.pos == 0) {
			return;
		}
		if (target.pos == 0) {
			target.Resize(source.len);
		}
		if (!target.r_samp) {
			target.r_samp = new BaseReservoirSampling();
		}
		for (idx_t src_idx = 0; src_idx < source.pos; src_idx++) {
			target.FillReservoir(target.len, source.v[src_idx]);
		}
	}